

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relations.cpp
# Opt level: O2

Relations * __thiscall dg::vr::Relations::invert(Relations *this)

{
  Type TVar1;
  long lVar2;
  _Base_bitset<1UL> local_30;
  
  local_30._M_w = 0;
  for (lVar2 = 0; lVar2 != 0x30; lVar2 = lVar2 + 4) {
    if (((this->bits).super__Base_bitset<1UL>._M_w >> ((ulong)*(Type *)((long)&all + lVar2) & 0x3f)
        & 1) != 0) {
      TVar1 = inverted(*(Type *)((long)&all + lVar2));
      std::bitset<12UL>::set((bitset<12UL> *)&local_30,(ulong)TVar1,true);
    }
  }
  (this->bits).super__Base_bitset<1UL>._M_w = local_30._M_w;
  return this;
}

Assistant:

Relations &Relations::invert() {
    std::bitset<Relations::total> newBits;
    for (Type rel : Relations::all) {
        if (has(rel)) {
            newBits.set(inverted(rel));
        }
    }

    std::swap(bits, newBits);
    return *this;
}